

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O0

int __thiscall net_uv::KCPSocket::connect(KCPSocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  char *__s;
  int iVar1;
  int iVar2;
  KCPSocket *extraout_RAX;
  uv_udp_t *puVar3;
  undefined8 uVar4;
  KCPSocket *extraout_RAX_00;
  int32_t errcode;
  undefined4 in_register_00000034;
  string local_c0;
  string local_a0;
  uint local_7c;
  undefined1 local_78 [4];
  int32_t r;
  sockaddr_in bind_addr;
  int32_t r_1;
  allocator<char> local_51;
  string local_50;
  sockaddr *local_30;
  sockaddr *addr;
  char *pcStack_20;
  uint32_t port_local;
  char *ip_local;
  KCPSocket *this_local;
  
  pcStack_20 = (char *)CONCAT44(in_register_00000034,__fd);
  addr._4_4_ = (uint32_t)__addr;
  if (this->m_kcpState == CLOSED) {
    ip_local = (char *)this;
    local_30 = net_getsocketAddr(pcStack_20,addr._4_4_,(uint32_t *)0x0);
    __s = pcStack_20;
    if (local_30 == (sockaddr *)0x0) {
      net_uvLog(3,"[%s:%d]Address resolution failed",pcStack_20,(ulong)addr._4_4_);
      this_local._7_1_ = 0;
      this = extraout_RAX;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
      Socket::setIp(&this->super_Socket,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      Socket::setPort(&this->super_Socket,addr._4_4_);
      setSocketAddr(this,local_30);
      this->m_soType = CLI_SO;
      if (this->m_udp == (uv_udp_t *)0x0) {
        puVar3 = (uv_udp_t *)malloc(0xd8);
        this->m_udp = puVar3;
        bind_addr.sin_zero._0_4_ = uv_udp_init((this->super_Socket).m_loop,this->m_udp);
        this->m_udp->data = this;
        bind_addr.sin_zero._0_4_ = uv_ip4_addr("0.0.0.0",0,(sockaddr_in *)local_78);
        bind_addr.sin_zero._0_4_ = uv_udp_bind(this->m_udp,(sockaddr *)local_78,0);
        net_adjustBuffSize((uv_handle_t *)this->m_udp,0x10000,0x10000);
      }
      local_7c = uv_udp_recv_start(this->m_udp,Socket::uv_on_alloc_buffer,uv_on_after_read);
      if (local_7c == 0) {
        changeState(this,SYN_SENT);
        iVar1 = rand();
        iVar2 = rand();
        this->m_randValue = iVar1 % 1000 + 1000 + iVar2 % 1000;
        kcp_making_syn_abi_cxx11_(&local_c0,(net_uv *)(ulong)(uint)this->m_randValue,iVar2 % 1000);
        udpSendStr(this,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        startIdle(this);
        this_local._7_1_ = 1;
        this = extraout_RAX_00;
      }
      else {
        net_getUVError_abi_cxx11_(&local_a0,(net_uv *)(ulong)local_7c,errcode);
        uVar4 = std::__cxx11::string::c_str();
        net_uvLog(3,"uv_udp_recv_start error: %s",uVar4);
        this = (KCPSocket *)std::__cxx11::string::~string((string *)&local_a0);
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool KCPSocket::connect(const char* ip, uint32_t port)
{
	if (m_kcpState != State::CLOSED)
	{
		return false;
	}

	struct sockaddr* addr = net_getsocketAddr(ip, port, NULL);

	if (addr == NULL)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "[%s:%d]Address resolution failed", ip, port);
		return false;
	}

	this->setIp(ip);
	this->setPort(port);
	this->setSocketAddr(addr);
	this->m_soType = KCPSOType::CLI_SO;

	if (m_udp == NULL)
	{
		m_udp = (uv_udp_t*)fc_malloc(sizeof(uv_udp_t));
		int32_t r = uv_udp_init(m_loop, m_udp);
		CHECK_UV_ASSERT(r);
		m_udp->data = this;

		struct sockaddr_in bind_addr;
		r = uv_ip4_addr("0.0.0.0", 0, &bind_addr);
		CHECK_UV_ASSERT(r);
		r = uv_udp_bind(m_udp, (const struct sockaddr *)&bind_addr, 0);
		CHECK_UV_ASSERT(r);
		//r = uv_udp_set_broadcast(m_udp, 1);
		//CHECK_UV_ASSERT(r);

		net_adjustBuffSize((uv_handle_t*)m_udp, KCP_UV_SOCKET_RECV_BUF_LEN, KCP_UV_SOCKET_SEND_BUF_LEN);
	}

	int32_t r = uv_udp_recv_start(m_udp, uv_on_alloc_buffer, uv_on_after_read);
	if (r != 0)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "uv_udp_recv_start error: %s", net_getUVError(r).c_str());
		return false;
	}

	changeState(State::SYN_SENT);
	m_randValue = std::rand() % 1000 + std::rand() % 1000 + 1000;
	this->udpSendStr(kcp_making_syn(m_randValue));

	startIdle();

	return true;
}